

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O0

Config * __thiscall QPDFJob::Config::emptyInput(Config *this)

{
  bool bVar1;
  element_type *peVar2;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  shared_ptr<char> local_20;
  Config *local_10;
  Config *this_local;
  
  local_10 = this;
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this->o);
  bVar1 = std::operator==(&peVar2->infilename,(nullptr_t)0x0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
    QUtil::make_shared_cstr((QUtil *)&local_20,&local_40);
    peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this->o);
    std::shared_ptr<char>::operator=(&peVar2->infilename,&local_20);
    std::shared_ptr<char>::~shared_ptr(&local_20);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,
               "empty input can\'t be used since input file has already been given",&local_79);
    usage(&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::emptyInput()
{
    if (o.m->infilename == nullptr) {
        // Various places in QPDFJob.cc know that the empty string for infile means empty. We set it
        // to something other than a null pointer as an indication that some input source has been
        // specified. This approach means that passing "" as the argument to inputFile in job JSON,
        // or equivalently using "" as a positional command-line argument would be the same as
        // --empty. This probably isn't worth blocking or coding around.
        o.m->infilename = QUtil::make_shared_cstr("");
    } else {
        usage("empty input can't be used since input file has already been given");
    }
    return this;
}